

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int)>::Invoke
          (FunctionMocker<int_(int,_int,_int,_int)> *this,int args,int args_1,int args_2,int args_3)

{
  int iVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<int> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<int>,_std::default_delete<testing::internal::ActionResultHolder<int>_>_>
  local_38;
  unique_ptr<testing::internal::ActionResultHolder<int>,_std::default_delete<testing::internal::ActionResultHolder<int>_>_>
  holder;
  ArgumentTuple tuple;
  int args_local_3;
  int args_local_2;
  int args_local_1;
  int args_local;
  FunctionMocker<int_(int,_int,_int,_int)> *this_local;
  
  tuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = args_3;
  tuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       args_2;
  args_local_3 = args_1;
  args_local_2 = args;
  _args_local_1 = this;
  std::tuple<int,_int,_int,_int>::tuple<int,_int,_int,_int,_true,_true>
            ((tuple<int,_int,_int,_int> *)&holder,&args_local_2,&args_local_3,
             &tuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
              _M_head_impl,
             &tuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
              .super__Head_base<1UL,_int,_false>._M_head_impl);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,(tuple<int,_int,_int,_int> *)&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<int>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<int>,std::default_delete<testing::internal::ActionResultHolder<int>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<int>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<int>,std::default_delete<testing::internal::ActionResultHolder<int>>>
              *)&local_38,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<int>,_std::default_delete<testing::internal::ActionResultHolder<int>_>_>
            ::operator->(&local_38);
  iVar1 = ActionResultHolder<int>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<int>,_std::default_delete<testing::internal::ActionResultHolder<int>_>_>
  ::~unique_ptr(&local_38);
  return iVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }